

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_FileNotExists_Test::TestBody(TApp_FileNotExists_Test *this)

{
  App *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  Option *pOVar4;
  long *plVar5;
  char *in_R9;
  long lVar6;
  char *pcVar7;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  string myfile;
  string filename;
  AssertionResult gtest_ar;
  stat buffer;
  AssertHelper AStack_3b8;
  AssertHelper local_3b0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  undefined1 local_3a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  undefined1 local_360 [32];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 local_280 [184];
  ios_base local_1c8 [264];
  stat local_c0;
  
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"TestNonFileNotUsed.txt","");
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      iVar3 = stat(local_380._M_dataplus._M_p,&local_c0);
      if (iVar3 == 0) {
        std::operator+(&local_2e0,"Path already exists: ",&local_380);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
      }
      else {
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        local_2e0._M_string_length = 0;
        local_2e0.field_2._M_local_buf[0] = '\0';
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2ee,
               "Expected: CLI::NonexistentPath(myfile) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_360,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_360);
    if (((local_2c0 != (undefined1  [8])0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2c0 != (undefined1  [8])0x0)) {
      (**(code **)(*(long *)local_2c0 + 8))();
    }
  }
  local_360._0_8_ = local_360 + 0x10;
  local_360._8_8_ = 0;
  local_360[0x10] = '\0';
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"--file","");
  pcVar7 = "";
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"","");
  this_00 = &(this->super_TApp).app;
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this_00,&local_300,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360
                      ,&local_320);
  local_340.super__Function_base._M_functor._8_8_ = 0;
  local_340.super__Function_base._M_functor._M_unused._M_object = CLI::NonexistentPath;
  local_340._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_340.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
  ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&>
            ((vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
              *)&pOVar4->validators_,&local_340);
  if (local_340.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_340.super__Function_base._M_manager)
              ((_Any_data *)&local_340,(_Any_data *)&local_340,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  local_2c0 = (undefined1  [8])local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"--file","");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,local_380._M_dataplus._M_p,
             local_380._M_dataplus._M_p + local_380._M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_2c0,local_280);
  lVar6 = 0;
  do {
    if (local_290 + lVar6 != *(undefined1 **)((long)local_2a0 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_2a0 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x40);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2c0,"myfile","filename",&local_380,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360);
  if (local_2c0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_3a0);
    if (local_2b8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2f5,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((((AssertHelperData *)local_3a0._0_8_ != (AssertHelperData *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_3a0._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  std::ofstream::ofstream(local_2c0,local_380._M_dataplus._M_p,_S_out);
  plVar5 = (long *)std::ostream::put((char)local_2c0);
  bVar1 = *(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20);
  local_2c0 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_2c0 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_2b8);
  std::ios_base::~ios_base(local_1c8);
  bVar2 = (bVar1 & 5) == 0;
  local_3a0[0] = bVar2;
  local_3a0._8_8_ = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c0,(internal *)local_3a0,(AssertionResult *)"ok","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2fa,(char *)local_2c0);
    testing::internal::AssertHelper::operator=(&AStack_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_3b8);
    if (local_2c0 != (undefined1  [8])local_2b0) {
      operator_delete((void *)local_2c0);
    }
    if (((CONCAT71(local_3b0.data_._1_7_,local_3b0.data_._0_1_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_3b0.data_._1_7_,local_3b0.data_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_3b0.data_._1_7_,local_3b0.data_._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3a0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_2c0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x2fb,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_2c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
  if (((local_2c0 != (undefined1  [8])0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_2c0 != (undefined1  [8])0x0)) {
    (**(code **)(*(long *)local_2c0 + 8))();
  }
  remove(local_380._M_dataplus._M_p);
  iVar3 = stat(local_380._M_dataplus._M_p,(stat *)local_2c0);
  if (iVar3 == 0) {
    if ((local_2b0[9] & 0x40) != 0) {
      pcVar7 = "File is actually a directory: ";
      goto LAB_0012773e;
    }
    local_3a0._0_8_ = local_3a0 + 0x10;
    local_3a0._8_8_ = 0;
    local_3a0[0x10] = '\0';
  }
  else {
    pcVar7 = "File does not exist: ";
LAB_0012773e:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                   pcVar7,&local_380);
  }
  local_3b0.data_._0_1_ = (internal)(local_3a0._8_8_ != 0);
  local_3a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((AssertHelperData *)local_3a0._0_8_ == (AssertHelperData *)(local_3a0 + 0x10)) {
    if (local_3a0._8_8_ != 0) goto LAB_00127829;
  }
  else {
    operator_delete((void *)local_3a0._0_8_);
    if (((byte)local_3b0.data_._0_1_ & 1) != 0) goto LAB_00127829;
  }
  testing::Message::Message((Message *)local_3a0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_2c0,(internal *)&local_3b0,
             (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x2fe,(char *)local_2c0);
  testing::internal::AssertHelper::operator=(&AStack_3b8,(Message *)local_3a0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_3b8);
  if (local_2c0 != (undefined1  [8])local_2b0) {
    operator_delete((void *)local_2c0);
  }
  if ((((AssertHelperData *)local_3a0._0_8_ != (AssertHelperData *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_3a0._0_8_ + 8))();
  }
LAB_00127829:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((AssertHelperData *)local_360._0_8_ != (AssertHelperData *)(local_360 + 0x10)) {
    operator_delete((void *)local_360._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, FileNotExists) {
    std::string myfile{"TestNonFileNotUsed.txt"};
    EXPECT_NO_THROW(CLI::NonexistentPath(myfile));

    std::string filename;
    app.add_option("--file", filename)->check(CLI::NonexistentPath);
    args = {"--file", myfile};

    run();
    EXPECT_EQ(myfile, filename);

    app.reset();

    bool ok = static_cast<bool>(std::ofstream(myfile.c_str()).put('a')); // create file
    EXPECT_TRUE(ok);
    EXPECT_THROW(run(), CLI::ValidationError);

    std::remove(myfile.c_str());
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());
}